

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_compress.c
# Opt level: O0

int getbits(archive_read_filter *self,int n)

{
  uint uVar1;
  long *plVar2;
  byte *pbVar3;
  void *pvVar4;
  int in_ESI;
  size_t in_RDI;
  ssize_t ret;
  int code;
  private_data *state;
  int64_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  plVar2 = *(long **)(in_RDI + 0x50);
  do {
    if (in_ESI <= *(int *)((long)plVar2 + 0x1c)) {
      uVar1 = *(uint *)(plVar2 + 3);
      *(int *)(plVar2 + 3) = (int)plVar2[3] >> ((byte)in_ESI & 0x1f);
      *(int *)((long)plVar2 + 0x1c) = *(int *)((long)plVar2 + 0x1c) - in_ESI;
      return uVar1 & getbits::mask[in_ESI];
    }
    if (plVar2[1] == 0) {
      if (plVar2[2] != 0) {
        __archive_read_filter_consume
                  ((archive_read_filter *)
                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                   in_stack_ffffffffffffffd0);
        plVar2[2] = 0;
      }
      pvVar4 = __archive_read_filter_ahead
                         ((archive_read_filter *)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                          (ssize_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
      *plVar2 = (long)pvVar4;
      if (in_stack_ffffffffffffffd0 == 0) {
        return -1;
      }
      if ((in_stack_ffffffffffffffd0 < 0) || (*plVar2 == 0)) {
        return -0x1e;
      }
      plVar2[1] = in_stack_ffffffffffffffd0;
      plVar2[2] = in_stack_ffffffffffffffd0;
    }
    pbVar3 = (byte *)*plVar2;
    *plVar2 = (long)(pbVar3 + 1);
    *(uint *)(plVar2 + 3) =
         (uint)*pbVar3 << ((byte)*(undefined4 *)((long)plVar2 + 0x1c) & 0x1f) |
         *(uint *)(plVar2 + 3);
    plVar2[1] = plVar2[1] + -1;
    *(int *)((long)plVar2 + 0x1c) = *(int *)((long)plVar2 + 0x1c) + 8;
    plVar2[4] = plVar2[4] + 1;
  } while( true );
}

Assistant:

static int
getbits(struct archive_read_filter *self, int n)
{
	struct private_data *state = (struct private_data *)self->data;
	int code;
	ssize_t ret;
	static const int mask[] = {
		0x00, 0x01, 0x03, 0x07, 0x0f, 0x1f, 0x3f, 0x7f, 0xff,
		0x1ff, 0x3ff, 0x7ff, 0xfff, 0x1fff, 0x3fff, 0x7fff, 0xffff
	};

	while (state->bits_avail < n) {
		if (state->avail_in <= 0) {
			if (state->consume_unnotified) {
				__archive_read_filter_consume(self->upstream,
					state->consume_unnotified);
				state->consume_unnotified = 0;
			}
			state->next_in
			    = __archive_read_filter_ahead(self->upstream,
				1, &ret);
			if (ret == 0)
				return (-1);
			if (ret < 0 || state->next_in == NULL)
				return (ARCHIVE_FATAL);
			state->consume_unnotified = state->avail_in = ret;
		}
		state->bit_buffer |= *state->next_in++ << state->bits_avail;
		state->avail_in--;
		state->bits_avail += 8;
		state->bytes_in_section++;
	}

	code = state->bit_buffer;
	state->bit_buffer >>= n;
	state->bits_avail -= n;

	return (code & mask[n]);
}